

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_icu::calendar_impl::set_option
          (calendar_impl *this,calendar_option_type opt,int param_2)

{
  runtime_error *prVar1;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  string local_40;
  
  if (opt == is_dst) {
    prVar1 = (runtime_error *)
             __cxa_allocate_exception
                       (0x30,CONCAT44(in_register_00000034,opt),
                        CONCAT44(in_register_00000014,param_2));
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"is_dst is not settable options for calendar","");
    runtime_error::runtime_error(prVar1,&local_40);
    *(undefined ***)prVar1 = &PTR__runtime_error_001d1028;
    (prVar1->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__date_time_error_001d1050;
    __cxa_throw(prVar1,&date_time_error::typeinfo,runtime_error::~runtime_error);
  }
  if (opt != is_gregorian) {
    return;
  }
  prVar1 = (runtime_error *)
           __cxa_allocate_exception
                     (0x30,CONCAT44(in_register_00000034,opt),CONCAT44(in_register_00000014,param_2)
                     );
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"is_gregorian is not settable options for calendar","");
  runtime_error::runtime_error(prVar1,&local_40);
  *(undefined ***)prVar1 = &PTR__runtime_error_001d1028;
  (prVar1->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__date_time_error_001d1050;
  __cxa_throw(prVar1,&date_time_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

virtual void set_option(calendar_option_type opt,int /*v*/) 
        {
            switch(opt) {
            case is_gregorian:
                throw date_time_error("is_gregorian is not settable options for calendar");
            case is_dst:
                throw date_time_error("is_dst is not settable options for calendar");
            default:
                ;
            }
        }